

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O3

int BZ2_bzDecompressInit(bz_stream *strm,int verbosity,int small)

{
  int iVar1;
  code *pcVar2;
  undefined8 *puVar3;
  
  iVar1 = -2;
  if ((((uint)verbosity < 5) && (iVar1 = -2, strm != (bz_stream *)0x0)) && ((uint)small < 2)) {
    pcVar2 = strm->bzalloc;
    if (pcVar2 == (_func_void_ptr_void_ptr_int_int *)0x0) {
      pcVar2 = default_bzalloc;
      strm->bzalloc = default_bzalloc;
    }
    if (strm->bzfree == (_func_void_void_ptr_void_ptr *)0x0) {
      strm->bzfree = default_bzfree;
    }
    puVar3 = (undefined8 *)(*pcVar2)(strm->opaque,0xfa90,1);
    if (puVar3 == (undefined8 *)0x0) {
      iVar1 = -3;
    }
    else {
      *puVar3 = strm;
      strm->state = puVar3;
      *(undefined4 *)(puVar3 + 1) = 10;
      puVar3[4] = 0;
      iVar1 = 0;
      *(undefined4 *)((long)puVar3 + 0xc74) = 0;
      strm->total_in_lo32 = 0;
      strm->total_in_hi32 = 0;
      strm->total_out_lo32 = 0;
      strm->total_out_hi32 = 0;
      *(char *)((long)puVar3 + 0x2c) = (char)small;
      *(undefined4 *)(puVar3 + 6) = 0;
      puVar3[0x18a] = 0;
      puVar3[0x18b] = 0;
      puVar3[0x18c] = 0;
      *(int *)((long)puVar3 + 0x34) = verbosity;
    }
  }
  return iVar1;
}

Assistant:

int BZ_API(BZ2_bzDecompressInit) 
                     ( bz_stream* strm, 
                       int        verbosity,
                       int        small )
{
   DState* s;

   if (!bz_config_ok()) return BZ_CONFIG_ERROR;

   if (strm == NULL) return BZ_PARAM_ERROR;
   if (small != 0 && small != 1) return BZ_PARAM_ERROR;
   if (verbosity < 0 || verbosity > 4) return BZ_PARAM_ERROR;

   if (strm->bzalloc == NULL) strm->bzalloc = default_bzalloc;
   if (strm->bzfree == NULL) strm->bzfree = default_bzfree;

   s = BZALLOC( sizeof(DState) );
   if (s == NULL) return BZ_MEM_ERROR;
   s->strm                  = strm;
   strm->state              = s;
   s->state                 = BZ_X_MAGIC_1;
   s->bsLive                = 0;
   s->bsBuff                = 0;
   s->calculatedCombinedCRC = 0;
   strm->total_in_lo32      = 0;
   strm->total_in_hi32      = 0;
   strm->total_out_lo32     = 0;
   strm->total_out_hi32     = 0;
   s->smallDecompress       = (Bool)small;
   s->ll4                   = NULL;
   s->ll16                  = NULL;
   s->tt                    = NULL;
   s->currBlockNo           = 0;
   s->verbosity             = verbosity;

   return BZ_OK;
}